

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::InitShaderCompilationThreadPool
          (RenderDeviceBase<Diligent::EngineVkImplTraits> *this,
          IThreadPool *pShaderCompilationThreadPool,Uint32 NumThreads)

{
  uint *puVar1;
  RefCntAutoPtr<Diligent::IThreadPool> local_98 [3];
  uint local_7c;
  uint local_78 [2];
  undefined1 local_70 [8];
  ThreadPoolCreateInfo ThreadPoolCI;
  uint local_20;
  Uint32 local_1c;
  Uint32 NumCores;
  Uint32 NumThreads_local;
  IThreadPool *pShaderCompilationThreadPool_local;
  RenderDeviceBase<Diligent::EngineVkImplTraits> *this_local;
  
  if ((this->m_DeviceInfo).Features.AsyncShaderCompilation != DEVICE_FEATURE_STATE_DISABLED) {
    local_1c = NumThreads;
    _NumCores = pShaderCompilationThreadPool;
    pShaderCompilationThreadPool_local = (IThreadPool *)this;
    if (pShaderCompilationThreadPool == (IThreadPool *)0x0) {
      if (NumThreads != 0) {
        ThreadPoolCI.OnThreadExiting._M_invoker._4_4_ = std::thread::hardware_concurrency();
        ThreadPoolCI.OnThreadExiting._M_invoker._0_4_ = 1;
        puVar1 = std::max<unsigned_int>
                           ((uint *)((long)&ThreadPoolCI.OnThreadExiting._M_invoker + 4),
                            (uint *)&ThreadPoolCI.OnThreadExiting._M_invoker);
        local_20 = *puVar1;
        ThreadPoolCreateInfo::ThreadPoolCreateInfo((ThreadPoolCreateInfo *)local_70);
        if (local_1c == 0xffffffff) {
          local_78[1] = 2;
          puVar1 = std::max<unsigned_int>(&local_20,local_78 + 1);
          local_70._0_4_ = *puVar1 - 1;
        }
        else {
          local_78[0] = local_20 << 2;
          local_7c = 0x80;
          puVar1 = std::max<unsigned_int>(local_78,&local_7c);
          puVar1 = std::min<unsigned_int>(&local_1c,puVar1);
          local_70._0_4_ = *puVar1;
        }
        local_70._4_4_ = 0;
        CreateThreadPool((Diligent *)local_98,(ThreadPoolCreateInfo *)local_70);
        RefCntAutoPtr<Diligent::IThreadPool>::operator=
                  (&this->m_pShaderCompilationThreadPool,local_98);
        RefCntAutoPtr<Diligent::IThreadPool>::~RefCntAutoPtr(local_98);
        ThreadPoolCreateInfo::~ThreadPoolCreateInfo((ThreadPoolCreateInfo *)local_70);
      }
    }
    else {
      RefCntAutoPtr<Diligent::IThreadPool>::operator=
                (&this->m_pShaderCompilationThreadPool,pShaderCompilationThreadPool);
    }
  }
  return;
}

Assistant:

void InitShaderCompilationThreadPool(IThreadPool* pShaderCompilationThreadPool, Uint32 NumThreads)
    {
        if (!m_DeviceInfo.Features.AsyncShaderCompilation)
            return;

        if (pShaderCompilationThreadPool != nullptr)
        {
            m_pShaderCompilationThreadPool = pShaderCompilationThreadPool;
        }
        else if (NumThreads != 0)
        {
            const Uint32 NumCores = (std::max)(std::thread::hardware_concurrency(), 1u);

            ThreadPoolCreateInfo ThreadPoolCI;
            if (NumThreads == ~0u)
            {
                // Leave one core for the main thread
                ThreadPoolCI.NumThreads = (std::max)(NumCores, 2u) - 1u;
            }
            else
            {
                ThreadPoolCI.NumThreads = (std::min)(NumThreads, (std::max)(NumCores * 4, 128u));
            }
            m_pShaderCompilationThreadPool = CreateThreadPool(ThreadPoolCI);
        }
    }